

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread_pool_extension.cpp
# Opt level: O0

bool __thiscall dlib::thread_pool_implementation::is_task_thread(thread_pool_implementation *this)

{
  byte bVar1;
  auto_mutex *in_RDI;
  auto_mutex M;
  undefined7 in_stack_ffffffffffffffb8;
  undefined1 in_stack_ffffffffffffffbf;
  thread_id_type in_stack_ffffffffffffffd0;
  thread_pool_implementation *in_stack_ffffffffffffffd8;
  
  auto_mutex::auto_mutex
            (in_RDI,(mutex *)CONCAT17(in_stack_ffffffffffffffbf,in_stack_ffffffffffffffb8));
  get_thread_id();
  bVar1 = is_worker_thread(in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0);
  auto_mutex::~auto_mutex((auto_mutex *)0x29d84c);
  return (bool)(bVar1 & 1);
}

Assistant:

bool thread_pool_implementation::
    is_task_thread (
    ) const
    {
        auto_mutex M(m);
        return is_worker_thread(get_thread_id());
    }